

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

FT_Error cf2_decoder_parse_charstrings
                   (PS_Decoder *decoder,FT_Byte *charstring_base,FT_ULong charstring_len)

{
  FT_Bool FVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  FT_Byte *pFVar5;
  FT_UShort FVar6;
  FT_Error FVar7;
  FT_Pointer pvVar8;
  FT_Bool local_9e;
  FT_Bool local_9d;
  CF2_F16Dot16 local_9c;
  undefined1 local_98 [2];
  FT_Bool scaled;
  FT_Bool hinted;
  CF2_F16Dot16 glyphWidth;
  CF2_Matrix transform;
  CF2_BufferRec buf;
  FT_Error error2;
  FT_Char no_stem_darkening_font;
  FT_Bool no_stem_darkening_driver;
  PS_Driver driver;
  PS_Builder *builder;
  CF2_Font pCStack_40;
  FT_Bool is_t1;
  CF2_Font font;
  FT_Memory pFStack_30;
  FT_Error error;
  FT_Memory memory;
  FT_ULong charstring_len_local;
  FT_Byte *charstring_base_local;
  PS_Decoder *decoder_local;
  
  font._4_4_ = 0;
  FVar1 = (decoder->builder).is_t1;
  if ((FVar1 == '\0') || (decoder->current_subfont != (CFF_SubFont)0x0)) {
    pFStack_30 = (decoder->builder).memory;
    pCStack_40 = (CF2_Font)decoder->cf2_instance->data;
    memory = (FT_Memory)charstring_len;
    charstring_len_local = (FT_ULong)charstring_base;
    charstring_base_local = (FT_Byte *)decoder;
    if (decoder->cf2_instance->data == (void *)0x0) {
      decoder->cf2_instance->finalizer = cf2_free_instance;
      pvVar8 = ft_mem_alloc(pFStack_30,0x290,(FT_Error *)((long)&font + 4));
      **(undefined8 **)(charstring_base_local + 0x428) = pvVar8;
      if (font._4_4_ != 0) {
        return 0x40;
      }
      pCStack_40 = (CF2_Font)**(long **)(charstring_base_local + 0x428);
      pCStack_40->memory = pFStack_30;
      if (FVar1 == '\0') {
        pCStack_40->cffload =
             *(FT_Service_CFFLoad *)(*(long *)(charstring_base_local + 0x418) + 0x1368);
      }
      cf2_outline_init(&pCStack_40->outline,pCStack_40->memory,&pCStack_40->error);
    }
    pFVar5 = charstring_base_local;
    pCStack_40->decoder = (PS_Decoder *)charstring_base_local;
    (pCStack_40->outline).decoder = (PS_Decoder *)charstring_base_local;
    lVar4 = *(long *)(*(long *)(charstring_base_local + 8) + 0xb0);
    cVar2 = *(char *)(lVar4 + 0x3c);
    cVar3 = *(char *)(*(long *)(*(long *)(charstring_base_local + 8) + 0xf0) + 0x70);
    memset(&transform.tx,0,0x20);
    memset(local_98,0,0x18);
    cf2_getScaleAndHintFlag
              ((PS_Decoder *)charstring_base_local,(CF2_F16Dot16 *)local_98,&transform.b,&local_9d,
               &local_9e);
    if (FVar1 == '\0') {
      pCStack_40->isCFF2 = *(FT_Bool *)(*(long *)(pFVar5 + 8) + 0x478);
    }
    else {
      pCStack_40->isCFF2 = '\0';
    }
    pCStack_40->isT1 = FVar1;
    pCStack_40->renderingFlags = 0;
    if (local_9d != '\0') {
      pCStack_40->renderingFlags = pCStack_40->renderingFlags | 1;
    }
    if ((local_9e != '\0') && ((cVar3 == '\0' || ((cVar3 < '\0' && (cVar2 == '\0')))))) {
      pCStack_40->renderingFlags = pCStack_40->renderingFlags | 2;
    }
    pCStack_40->darkenParams[0] = *(FT_Int *)(lVar4 + 0x40);
    pCStack_40->darkenParams[1] = *(FT_Int *)(lVar4 + 0x44);
    pCStack_40->darkenParams[2] = *(FT_Int *)(lVar4 + 0x48);
    pCStack_40->darkenParams[3] = *(FT_Int *)(lVar4 + 0x4c);
    pCStack_40->darkenParams[4] = *(FT_Int *)(lVar4 + 0x50);
    pCStack_40->darkenParams[5] = *(FT_Int *)(lVar4 + 0x54);
    pCStack_40->darkenParams[6] = *(FT_Int *)(lVar4 + 0x58);
    pCStack_40->darkenParams[7] = *(FT_Int *)(lVar4 + 0x5c);
    FVar6 = cf2_getUnitsPerEm((PS_Decoder *)charstring_base_local);
    pCStack_40->unitsPerEm = (uint)FVar6;
    if ((local_9e == '\0') ||
       (decoder_local._4_4_ = cf2_checkTransform((CF2_Matrix *)local_98,pCStack_40->unitsPerEm),
       decoder_local._4_4_ == 0)) {
      FVar7 = cf2_getGlyphOutline(pCStack_40,(CF2_Buffer)&transform.tx,(CF2_Matrix *)local_98,
                                  &local_9c);
      if (FVar7 == 0) {
        cf2_setGlyphWidth(&pCStack_40->outline,local_9c);
        decoder_local._4_4_ = 0;
      }
      else {
        decoder_local._4_4_ = 3;
      }
    }
  }
  else {
    decoder_local._4_4_ = 8;
  }
  return decoder_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_decoder_parse_charstrings( PS_Decoder*  decoder,
                                 FT_Byte*     charstring_base,
                                 FT_ULong     charstring_len )
  {
    FT_Memory  memory;
    FT_Error   error = FT_Err_Ok;
    CF2_Font   font;

    FT_Bool    is_t1 = decoder->builder.is_t1;


    FT_ASSERT( decoder &&
               ( is_t1 || decoder->cff ) );

    if ( is_t1 && !decoder->current_subfont )
    {
      FT_ERROR(( "cf2_decoder_parse_charstrings (Type 1): "
                 "SubFont missing. Use `t1_make_subfont' first\n" ));
      return FT_THROW( Invalid_Table );
    }

    memory = decoder->builder.memory;

    /* CF2 data is saved here across glyphs */
    font = (CF2_Font)decoder->cf2_instance->data;

    /* on first glyph, allocate instance structure */
    if ( !decoder->cf2_instance->data )
    {
      decoder->cf2_instance->finalizer =
        (FT_Generic_Finalizer)cf2_free_instance;

      if ( FT_ALLOC( decoder->cf2_instance->data,
                     sizeof ( CF2_FontRec ) ) )
        return FT_THROW( Out_Of_Memory );

      font = (CF2_Font)decoder->cf2_instance->data;

      font->memory = memory;

      if ( !is_t1 )
        font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;

      /* initialize a client outline, to be shared by each glyph rendered */
      cf2_outline_init( &font->outline, font->memory, &font->error );
    }

    /* save decoder; it is a stack variable and will be different on each */
    /* call                                                               */
    font->decoder         = decoder;
    font->outline.decoder = decoder;

    {
      /* build parameters for Adobe engine */

      PS_Builder*  builder = &decoder->builder;
      PS_Driver    driver  = (PS_Driver)FT_FACE_DRIVER( builder->face );

      FT_Bool  no_stem_darkening_driver =
                 driver->no_stem_darkening;
      FT_Char  no_stem_darkening_font =
                 builder->face->internal->no_stem_darkening;

      /* local error */
      FT_Error       error2 = FT_Err_Ok;
      CF2_BufferRec  buf;
      CF2_Matrix     transform;
      CF2_F16Dot16   glyphWidth;

      FT_Bool  hinted;
      FT_Bool  scaled;


      /* FreeType has already looked up the GID; convert to         */
      /* `RegionBuffer', assuming that the input has been validated */
      FT_ASSERT( charstring_base + charstring_len >= charstring_base );

      FT_ZERO( &buf );
      buf.start =
      buf.ptr   = charstring_base;
      buf.end   = charstring_base + charstring_len;

      FT_ZERO( &transform );

      cf2_getScaleAndHintFlag( decoder,
                               &transform.a,
                               &transform.d,
                               &hinted,
                               &scaled );

      if ( is_t1 )
        font->isCFF2 = FALSE;
      else
      {
        /* copy isCFF2 boolean from TT_Face to CF2_Font */
        font->isCFF2 = ((TT_Face)builder->face)->is_cff2;
      }
      font->isT1 = is_t1;

      font->renderingFlags = 0;
      if ( hinted )
        font->renderingFlags |= CF2_FlagsHinted;
      if ( scaled && ( !no_stem_darkening_font        ||
                       ( no_stem_darkening_font < 0 &&
                         !no_stem_darkening_driver  ) ) )
        font->renderingFlags |= CF2_FlagsDarkened;

      font->darkenParams[0] = driver->darken_params[0];
      font->darkenParams[1] = driver->darken_params[1];
      font->darkenParams[2] = driver->darken_params[2];
      font->darkenParams[3] = driver->darken_params[3];
      font->darkenParams[4] = driver->darken_params[4];
      font->darkenParams[5] = driver->darken_params[5];
      font->darkenParams[6] = driver->darken_params[6];
      font->darkenParams[7] = driver->darken_params[7];

      /* now get an outline for this glyph;      */
      /* also get units per em to validate scale */
      font->unitsPerEm = (CF2_Int)cf2_getUnitsPerEm( decoder );

      if ( scaled )
      {
        error2 = cf2_checkTransform( &transform, font->unitsPerEm );
        if ( error2 )
          return error2;
      }

      error2 = cf2_getGlyphOutline( font, &buf, &transform, &glyphWidth );
      if ( error2 )
        return FT_ERR( Invalid_File_Format );

      cf2_setGlyphWidth( &font->outline, glyphWidth );

      return FT_Err_Ok;
    }
  }